

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O1

void SUNDenseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  fputc(10,(FILE *)outfile);
  if (0 < *A->content) {
    lVar2 = 0;
    do {
      pvVar1 = A->content;
      if (0 < *(long *)((long)pvVar1 + 8)) {
        lVar3 = 0;
        do {
          fprintf((FILE *)outfile,"%12g  ",
                  *(undefined8 *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + lVar3 * 8) + lVar2 * 8)
                 );
          lVar3 = lVar3 + 1;
          pvVar1 = A->content;
        } while (lVar3 < *(long *)((long)pvVar1 + 8));
      }
      fputc(10,(FILE *)outfile);
      lVar2 = lVar2 + 1;
    } while (lVar2 < *A->content);
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNDenseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_D(A); i++)
  {
    for (j = 0; j < SM_COLUMNS_D(A); j++)
    {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile, "%12Lg  ", SM_ELEMENT_D(A, i, j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile, "%12g  ", SM_ELEMENT_D(A, i, j));
#else
      fprintf(outfile, "%12g  ", SM_ELEMENT_D(A, i, j));
#endif
    }
    fprintf(outfile, "\n");
  }
  fprintf(outfile, "\n");
  return;
}